

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XPMPMultiplayer.cpp
# Opt level: O2

bool XPMP2::FindResFile(char *fName,string *outPath,bool bRequired)

{
  bool bVar1;
  string path;
  
  std::operator+(&path,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &DAT_002cc678,fName);
  bVar1 = ExistsFile(&path);
  if (bVar1) {
    std::__cxx11::string::operator=((string *)outPath,(string *)&path);
  }
  else if ((bRequired) && (glob < 5)) {
    LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/XPMP2/src/XPMPMultiplayer.cpp"
           ,0x35,"FindResFile",logFATAL,"File \'%s\' is missing in resource directory \'%s\'",fName,
           DAT_002cc678);
  }
  std::__cxx11::string::~string((string *)&path);
  return bVar1;
}

Assistant:

static bool FindResFile (const char* fName, std::string& outPath,
                         bool bRequired = true)
{
    std::string path = glob.resourceDir + fName;
    if (ExistsFile(path)) {
        outPath = std::move(path);
        return true;
    } else {
        if (bRequired) {
            LOG_MSG(logFATAL, ERR_RSRC_FILE_UNAVAIL,
                    fName, glob.resourceDir.c_str());
        }
        return false;
    }
}